

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_StateData.cpp
# Opt level: O2

void __thiscall
amrex::StateData::define
          (StateData *this,Box *p_domain,BoxArray *grds,DistributionMapping *dm,StateDescriptor *d,
          Real time,Real dt,FabFactory<amrex::FArrayBox> *factory)

{
  BoxArray *this_00;
  _Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false> _Var1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  IndexType typ;
  TimeCenter TVar5;
  _Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false> _Var6;
  MFInfo *__args_5;
  uint uVar7;
  long lVar8;
  uint uVar9;
  MultiFab *pMVar10;
  MultiFab *pMVar11;
  MultiFab *local_78 [3];
  undefined1 local_60 [4];
  int ncomp;
  MFInfo local_58;
  undefined4 extraout_var;
  
  uVar2 = *(undefined8 *)(p_domain->smallend).vect;
  uVar3 = *(undefined8 *)((p_domain->smallend).vect + 2);
  uVar4 = *(undefined8 *)((p_domain->bigend).vect + 2);
  *(undefined8 *)(this->domain).bigend.vect = *(undefined8 *)(p_domain->bigend).vect;
  *(undefined8 *)((this->domain).bigend.vect + 2) = uVar4;
  *(undefined8 *)(this->domain).smallend.vect = uVar2;
  *(undefined8 *)((this->domain).smallend.vect + 2) = uVar3;
  this->desc = d;
  this->arena = (Arena *)0x0;
  this_00 = &this->grids;
  local_78[1] = (MultiFab *)dt;
  local_78[2] = (MultiFab *)time;
  BoxArray::operator=(this_00,grds);
  std::__shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2> *)
             &this->dmap,
             (__shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2> *)dm);
  _Var6._M_head_impl._0_4_ = (*factory->_vptr_FabFactory[5])(factory);
  _Var6._M_head_impl._4_4_ = extraout_var;
  _Var1._M_head_impl =
       (this->m_factory)._M_t.
       super___uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
       .super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>._M_head_impl;
  (this->m_factory)._M_t.
  super___uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
  .super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>._M_head_impl =
       _Var6._M_head_impl;
  if (_Var1._M_head_impl != (FabFactory<amrex::FArrayBox> *)0x0) {
    (*(_Var1._M_head_impl)->_vptr_FabFactory[1])();
  }
  typ = StateDescriptor::getType(this->desc);
  TVar5 = StateDescriptor::timeType(this->desc);
  if (typ.itype != 0) {
    for (lVar8 = 0; lVar8 != 3; lVar8 = lVar8 + 1) {
      uVar9 = 1 << ((byte)lVar8 & 0x1f);
      uVar7 = (uint)lVar8;
      (this->domain).bigend.vect[lVar8] =
           ((this->domain).bigend.vect[lVar8] + (uint)((typ.itype >> (uVar7 & 0x1f) & 1) != 0)) -
           (uint)(((this->domain).btype.itype >> (uVar7 & 0x1f) & 1) != 0);
      if ((typ.itype >> (uVar7 & 0x1f) & 1) == 0) {
        uVar9 = ~uVar9 & (this->domain).btype.itype;
      }
      else {
        uVar9 = uVar9 | (this->domain).btype.itype;
      }
      (this->domain).btype.itype = uVar9;
    }
    BoxArray::convert(this_00,typ);
  }
  pMVar10 = (MultiFab *)((double)local_78[2] - (double)local_78[1]);
  pMVar11 = local_78[2];
  if (TVar5 != Point) {
    pMVar11 = (MultiFab *)((double)local_78[1] + (double)local_78[2]);
    pMVar10 = local_78[2];
  }
  (this->new_time).stop = (Real)pMVar11;
  (this->new_time).start = (Real)local_78[2];
  (this->old_time).stop = (Real)pMVar10;
  (this->old_time).start = (double)local_78[2] - (double)local_78[1];
  ncomp = StateDescriptor::nComp(this->desc);
  local_60 = (undefined1  [4])StateDescriptor::nExtra(this->desc);
  local_58._0_8_ = (Arena *)0x1;
  local_58.arena = (Arena *)0x0;
  local_58.tags.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.tags.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58.tags.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  __args_5 = MFInfo::SetTag(&local_58,"StateData");
  __args_5->arena = this->arena;
  std::
  make_unique<amrex::MultiFab,amrex::BoxArray&,amrex::DistributionMapping&,int&,int,amrex::MFInfo&,amrex::FabFactory<amrex::FArrayBox>&>
            ((BoxArray *)local_78,(DistributionMapping *)this_00,(int *)&this->dmap,&ncomp,
             (MFInfo *)local_60,(FabFactory<amrex::FArrayBox> *)__args_5);
  pMVar10 = local_78[0];
  local_78[0] = (MultiFab *)0x0;
  pMVar11 = (this->new_data)._M_t.
            super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>._M_t.
            super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
            super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl;
  (this->new_data)._M_t.
  super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>._M_t.
  super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
  super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl = pMVar10;
  if (pMVar11 != (MultiFab *)0x0) {
    (**(code **)(*(long *)&(pMVar11->super_FabArray<amrex::FArrayBox>).super_FabArrayBase + 8))();
    if (local_78[0] != (MultiFab *)0x0) {
      (**(code **)(*(long *)local_78[0] + 8))();
    }
  }
  local_78[0] = (MultiFab *)0x0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_58.tags.
             super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           );
  pMVar11 = (this->old_data)._M_t.
            super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>._M_t.
            super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
            super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl;
  (this->old_data)._M_t.
  super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>._M_t.
  super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
  super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl = (MultiFab *)0x0;
  if (pMVar11 != (MultiFab *)0x0) {
    (**(code **)(*(long *)&(pMVar11->super_FabArray<amrex::FArrayBox>).super_FabArrayBase + 8))();
  }
  return;
}

Assistant:

void
StateData::define (const Box&             p_domain,
                   const BoxArray&        grds,
                   const DistributionMapping& dm,
                   const StateDescriptor& d,
                   Real                   time,
                   Real                   dt,
                   const FabFactory<FArrayBox>& factory)
{
    BL_PROFILE("StateData::define()");
    domain = p_domain;
    desc = &d;
    arena = nullptr;
    grids = grds;
    dmap = dm;
    m_factory.reset(factory.clone());
    //
    // Convert to proper type.
    //
    IndexType typ(desc->getType());
    StateDescriptor::TimeCenter t_typ(desc->timeType());
    if (!typ.cellCentered())
    {
        domain.convert(typ);
        grids.convert(typ);
    }
    if (t_typ == StateDescriptor::Point)
    {
        new_time.start = new_time.stop = time;
        old_time.start = old_time.stop = time - dt;
    }
    else
    {
        new_time.start = time;
        new_time.stop  = time+dt;
        old_time.start = time-dt;
        old_time.stop  = time;
    }
    int ncomp = desc->nComp();

    new_data = std::make_unique<MultiFab>(grids,dmap,ncomp,desc->nExtra(),
                                          MFInfo().SetTag("StateData").SetArena(arena),
                                          *m_factory);
    old_data.reset();
}